

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCUtil.cpp
# Opt level: O1

void __thiscall Assimp::IFC::TempMesh::FixupFaceOrientation(TempMesh *this)

{
  uint uVar1;
  pointer puVar2;
  iterator __position;
  double *pdVar3;
  double *pdVar4;
  unsigned_long uVar5;
  aiVector3t<double> *paVar6;
  unsigned_long *puVar7;
  unsigned_long uVar8;
  vector<unsigned_long,std::allocator<unsigned_long>> *this_00;
  double *pdVar9;
  mapped_type *pmVar10;
  mapped_type *pmVar11;
  unsigned_long uVar12;
  __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
  _Var13;
  ulong uVar14;
  aiVector3t<double> *paVar15;
  pointer puVar16;
  ulong uVar17;
  ulong uVar18;
  double *pdVar19;
  pointer paVar20;
  aiVector3t<double> *paVar21;
  double dVar22;
  pointer paVar23;
  ulong uVar24;
  long lVar25;
  double *pdVar26;
  double dVar27;
  ulong *puVar28;
  unsigned_long *puVar29;
  double *pdVar30;
  int iVar31;
  pointer paVar32;
  ulong uVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  size_t farthestIndex;
  vector<unsigned_long,_std::allocator<unsigned_long>_> todo;
  vector<unsigned_long,_std::allocator<unsigned_long>_> faceStartIndices;
  size_t nbi;
  vector<unsigned_long,_std::allocator<unsigned_long>_> neighbour;
  IfcVector3 vavg;
  IfcVector3 farthestNormal;
  map<aiVector3t<double>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_Assimp::IFC::CompareVector,_std::allocator<std::pair<const_aiVector3t<double>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  facesByVertex;
  unsigned_long local_140;
  double local_138;
  vector<bool,_std::allocator<bool>_> local_130;
  unsigned_long *local_108;
  iterator iStack_100;
  unsigned_long *local_f8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_e8;
  double local_d0;
  ulong local_c8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_c0;
  double local_a8;
  double dStack_a0;
  double local_98;
  IfcVector3 local_90;
  IfcVector3 local_78;
  _Rb_tree<aiVector3t<double>,_std::pair<const_aiVector3t<double>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::_Select1st<std::pair<const_aiVector3t<double>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_Assimp::IFC::CompareVector,_std::allocator<std::pair<const_aiVector3t<double>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  local_60;
  
  Center(&local_90,this);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_e8,
             (long)(this->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 2,(allocator_type *)&local_60);
  if ((this->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar8 = 0;
    uVar18 = 0;
    do {
      local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[uVar18] = uVar8;
      puVar2 = (this->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar8 = uVar8 + puVar2[uVar18];
      uVar18 = uVar18 + 1;
    } while (uVar18 < (ulong)((long)(this->mVertcnt).
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 2));
  }
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((this->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start) {
    do {
      if ((this->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start
          [(long)local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p] != 0) {
        lVar25 = 0;
        uVar18 = 0;
        do {
          this_00 = (vector<unsigned_long,std::allocator<unsigned_long>> *)
                    std::
                    map<aiVector3t<double>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_Assimp::IFC::CompareVector,_std::allocator<std::pair<const_aiVector3t<double>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                    ::operator[]((map<aiVector3t<double>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_Assimp::IFC::CompareVector,_std::allocator<std::pair<const_aiVector3t<double>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                                  *)&local_60,
                                 (key_type *)
                                 ((long)&(this->mVerts).
                                         super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start
                                         [local_e8.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_start
                                          [(long)local_130.
                                                 super__Bvector_base<std::allocator<bool>_>._M_impl.
                                                 super__Bvector_impl_data._M_start.
                                                 super__Bit_iterator_base._M_p]].x + lVar25));
          __position._M_current = *(unsigned_long **)(this_00 + 8);
          if (__position._M_current == *(unsigned_long **)(this_00 + 0x10)) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>(this_00,__position,(unsigned_long *)&local_130);
          }
          else {
            *__position._M_current =
                 (unsigned_long)
                 local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
            *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
          }
          uVar18 = uVar18 + 1;
          lVar25 = lVar25 + 0x18;
        } while (uVar18 < (this->mVertcnt).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start
                          [(long)local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p]);
      }
      local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p =
           (_Bit_type *)
           ((long)local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + 1);
    } while (local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p <
             (_Bit_type *)
             ((long)(this->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 2));
  }
  local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (ulong *)0xffffffffffffffff;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_c0,
             ((long)(this->mVerts).
                    super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->mVerts).
                    super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
             (value_type_conflict3 *)&local_130,(allocator_type *)&local_a8);
  pdVar9 = (double *)operator_new(0x50);
  pdVar9[8] = 0.0;
  pdVar9[9] = 0.0;
  pdVar9[6] = 0.0;
  pdVar9[7] = 0.0;
  pdVar9[4] = 0.0;
  pdVar9[5] = 0.0;
  pdVar9[2] = 0.0;
  pdVar9[3] = 0.0;
  *pdVar9 = 0.0;
  pdVar9[1] = 0.0;
  if ((this->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (this->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start) {
    dVar27 = 0.0;
  }
  else {
    dVar22 = 0.0;
    do {
      uVar18 = (ulong)(this->mVertcnt).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start[(long)dVar22];
      if (uVar18 != 0) {
        uVar33 = 0;
        local_138 = dVar22;
        do {
          uVar8 = local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start[(long)local_138];
          lVar25 = uVar8 + uVar33;
          pmVar10 = std::
                    map<aiVector3t<double>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_Assimp::IFC::CompareVector,_std::allocator<std::pair<const_aiVector3t<double>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                    ::operator[]((map<aiVector3t<double>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_Assimp::IFC::CompareVector,_std::allocator<std::pair<const_aiVector3t<double>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                                  *)&local_60,
                                 (this->mVerts).
                                 super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar25);
          uVar33 = uVar33 + 1;
          pmVar11 = std::
                    map<aiVector3t<double>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_Assimp::IFC::CompareVector,_std::allocator<std::pair<const_aiVector3t<double>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                    ::operator[]((map<aiVector3t<double>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_Assimp::IFC::CompareVector,_std::allocator<std::pair<const_aiVector3t<double>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                                  *)&local_60,
                                 (this->mVerts).
                                 super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + uVar8 + uVar33 % uVar18
                                );
          pdVar19 = (double *)
                    (pmVar10->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          pdVar3 = (double *)
                   (pmVar10->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
          pdVar26 = pdVar9;
          if (pdVar19 != pdVar3) {
            pdVar30 = (double *)
                      (pmVar11->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                      _M_impl.super__Vector_impl_data._M_start;
            pdVar4 = (double *)
                     (pmVar11->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
            do {
              if (pdVar30 == pdVar4) break;
              dVar27 = *pdVar19;
              if ((ulong)dVar27 < (ulong)*pdVar30) {
                pdVar19 = pdVar19 + 1;
              }
              else if ((ulong)*pdVar30 < (ulong)dVar27) {
                pdVar30 = pdVar30 + 1;
              }
              else {
                *pdVar26 = dVar27;
                pdVar19 = pdVar19 + 1;
                pdVar30 = pdVar30 + 1;
                pdVar26 = pdVar26 + 1;
              }
            } while (pdVar19 != pdVar3);
          }
          if ((long)pdVar26 - (long)pdVar9 == 0x10) {
            local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[lVar25] = (unsigned_long)pdVar9[*pdVar9 == local_138];
          }
          uVar18 = (ulong)(this->mVertcnt).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start[(long)local_138];
          dVar22 = local_138;
        } while (uVar33 < uVar18);
      }
      dVar22 = (double)((long)dVar22 + 1);
      dVar27 = (double)((long)(this->mVertcnt).
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->mVertcnt).
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 2);
    } while ((ulong)dVar22 < (ulong)dVar27);
  }
  local_a8 = (double)((ulong)local_a8 & 0xffffffffffffff00);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_130,(size_type)dVar27,(bool *)&local_a8,(allocator_type *)&local_78);
  if (local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_offset != 0 ||
      local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p !=
      local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_p) {
    do {
      lVar25 = 0;
      uVar18 = 0;
      puVar28 = local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
      do {
        lVar25 = (lVar25 + 1) - (ulong)((*puVar28 >> (uVar18 & 0x3f) & 1) != 0);
        iVar31 = (int)uVar18;
        puVar28 = puVar28 + (iVar31 == 0x3f);
        uVar18 = (ulong)(iVar31 + 1);
        if (iVar31 == 0x3f) {
          uVar18 = 0;
        }
      } while ((puVar28 !=
                local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p) ||
              ((uint)uVar18 !=
               local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
               ._M_finish.super__Bit_iterator_base._M_offset));
      if (lVar25 == 0) break;
      local_140 = 0xffffffffffffffff;
      puVar2 = (this->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar25 = (long)(this->mVertcnt).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)puVar2;
      if (lVar25 != 0) {
        lVar25 = lVar25 >> 2;
        dVar27 = -1.0;
        uVar18 = 0;
        do {
          uVar33 = uVar18 + 0x3f;
          if (-1 < (long)uVar18) {
            uVar33 = uVar18;
          }
          if ((local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
               ._M_start.super__Bit_iterator_base._M_p
               [((long)uVar33 >> 6) +
                ((ulong)((uVar18 & 0x800000000000003f) < 0x8000000000000001) - 1)] >>
               (uVar18 & 0x3f) & 1) == 0) {
            uVar1 = puVar2[uVar18];
            if ((ulong)uVar1 == 0) {
              dVar22 = 0.0;
              dVar35 = 0.0;
              dVar34 = 0.0;
            }
            else {
              paVar32 = (this->mVerts).
                        super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start +
                        local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar18];
              paVar20 = paVar32 + uVar1;
              dVar35 = 0.0;
              dVar22 = 0.0;
              dVar34 = 0.0;
              do {
                dVar34 = dVar34 + paVar32->x;
                dVar22 = dVar22 + paVar32->y;
                dVar35 = dVar35 + paVar32->z;
                paVar32 = paVar32 + 1;
              } while (paVar32 != paVar20);
            }
            dVar36 = 1.0 / (double)uVar1;
            dVar34 = dVar34 * dVar36 - local_90.x;
            dVar22 = dVar22 * dVar36 - local_90.y;
            dVar35 = dVar36 * dVar35 - local_90.z;
            dVar22 = dVar35 * dVar35 + dVar34 * dVar34 + dVar22 * dVar22;
            if (dVar27 < dVar22) {
              dVar27 = dVar22;
              local_140 = uVar18;
            }
          }
          uVar18 = uVar18 + 1;
        } while (uVar18 != lVar25 + (ulong)(lVar25 == 0));
      }
      ComputePolygonNormal
                (&local_78,
                 (this->mVerts).
                 super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_start +
                 local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[local_140],(ulong)puVar2[local_140],true);
      uVar1 = (this->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start[local_140];
      if ((ulong)uVar1 == 0) {
        dVar22 = 0.0;
        dVar27 = 0.0;
        dVar34 = 0.0;
      }
      else {
        paVar20 = (this->mVerts).
                  super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_start +
                  local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start[local_140];
        paVar32 = paVar20 + uVar1;
        dVar27 = 0.0;
        dVar22 = 0.0;
        dVar34 = 0.0;
        do {
          dVar34 = dVar34 + paVar20->x;
          dVar22 = dVar22 + paVar20->y;
          dVar27 = dVar27 + paVar20->z;
          paVar20 = paVar20 + 1;
        } while (paVar20 != paVar32);
      }
      dVar35 = 1.0 / (double)uVar1;
      dVar34 = dVar34 * dVar35 - local_90.x;
      dVar36 = dVar22 * dVar35 - local_90.y;
      dVar22 = dVar35 * dVar27 - local_90.z;
      dVar27 = dVar22 * dVar22 + dVar34 * dVar34 + dVar36 * dVar36;
      if (dVar27 < 0.0) {
        local_138 = dVar34;
        local_d0 = dVar22;
        dVar27 = sqrt(dVar27);
        dVar22 = local_d0;
        dVar34 = local_138;
      }
      else {
        dVar27 = SQRT(dVar27);
      }
      dVar27 = 1.0 / dVar27;
      if (dVar22 * dVar27 * local_78.z + dVar34 * dVar27 * local_78.x + dVar36 * dVar27 * local_78.y
          < -0.4) {
        uVar8 = local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[local_140];
        uVar18 = (ulong)(this->mVertcnt).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start[local_140];
        if (uVar18 != 0) {
          paVar20 = (this->mVerts).
                    super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          paVar32 = paVar20 + uVar8;
          paVar23 = paVar32 + (uVar18 - 1);
          if (paVar32 < paVar23) {
            paVar32 = paVar20 + uVar8;
            do {
              paVar20 = paVar32 + 1;
              local_98 = paVar32->z;
              local_a8 = paVar32->x;
              dStack_a0 = paVar32->y;
              paVar32->z = paVar23->z;
              dVar27 = paVar23->y;
              paVar32->x = paVar23->x;
              paVar32->y = dVar27;
              paVar23->z = local_98;
              paVar23->x = local_a8;
              paVar23->y = dStack_a0;
              paVar23 = paVar23 + -1;
              paVar32 = paVar20;
            } while (paVar20 < paVar23);
          }
        }
        if ((uVar18 != 0) &&
           (puVar16 = local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start + uVar8 + (uVar18 - 1),
           local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start + uVar8 < puVar16)) {
          puVar7 = local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start + uVar8;
          do {
            puVar29 = puVar7 + 1;
            uVar5 = *puVar7;
            *puVar7 = *puVar16;
            *puVar16 = uVar5;
            puVar16 = puVar16 + -1;
            puVar7 = puVar29;
          } while (puVar29 < puVar16);
        }
        while (uVar18 = uVar18 - 1, uVar18 != 0) {
          uVar12 = uVar8 + 1;
          uVar5 = local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start[uVar8];
          local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[uVar8] =
               local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[uVar12];
          local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[uVar12] = uVar5;
          uVar8 = uVar12;
        }
      }
      uVar18 = local_140 + 0x3f;
      if (-1 < (long)local_140) {
        uVar18 = local_140;
      }
      dVar27 = -3.11261356879985e-322;
      local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p
      [((long)uVar18 >> 6) + ((ulong)((local_140 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
           local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p
           [((long)uVar18 >> 6) +
            ((ulong)((local_140 & 0x800000000000003f) < 0x8000000000000001) - 1)] |
           1L << ((byte)local_140 & 0x3f);
      local_108 = (unsigned_long *)0x0;
      iStack_100._M_current = (unsigned_long *)0x0;
      local_f8 = (unsigned_long *)0x0;
      std::vector<unsigned_long,std::allocator<unsigned_long>>::
      _M_realloc_insert<unsigned_long_const&>
                ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_108,(iterator)0x0,
                 &local_140);
      local_d0 = -3.11261356879985e-322;
      if (local_108 != iStack_100._M_current) {
        do {
          puVar7 = iStack_100._M_current + -1;
          iStack_100._M_current = iStack_100._M_current + -1;
          dVar22 = (double)local_e8.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start[*puVar7];
          uVar18 = (ulong)(this->mVertcnt).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start[*puVar7];
          if (uVar18 != 0) {
            uVar33 = 0;
            local_138 = dVar22;
            do {
              local_c8 = local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_start[uVar33 + (long)dVar22];
              if (local_c8 != 0xffffffffffffffff) {
                uVar17 = local_c8 + 0x3f;
                if (-1 < (long)local_c8) {
                  uVar17 = local_c8;
                }
                if ((local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                     [((long)uVar17 >> 6) +
                      ((ulong)((local_c8 & (ulong)dVar27) < 0x8000000000000001) - 1)] >>
                     (local_c8 & 0x3f) & 1) == 0) {
                  uVar8 = local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start[local_c8];
                  uVar17 = (ulong)(this->mVertcnt).
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start[local_c8];
                  paVar32 = (this->mVerts).
                            super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + uVar8;
                  _Var13 = std::
                           __find_if<__gnu_cxx::__normal_iterator<aiVector3t<double>*,std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>>,__gnu_cxx::__ops::_Iter_pred<Assimp::IFC::FindVector>>
                                     (paVar32,paVar32 + uVar17);
                  dVar27 = local_d0;
                  dVar22 = local_138;
                  paVar32 = (this->mVerts).
                            super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  paVar6 = paVar32 + uVar8;
                  if (_Var13._M_current == paVar6 + uVar17) {
                    __assert_fail("it != mVerts.begin() + nbvsi + nbvc",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Importer/IFC/IFCUtil.cpp"
                                  ,0x162,"void Assimp::IFC::TempMesh::FixupFaceOrientation()");
                  }
                  uVar24 = (((long)_Var13._M_current - (long)paVar6 >> 3) * -0x5555555555555555 + 1U
                           ) % uVar17;
                  uVar14 = uVar33 + 1;
                  if (uVar14 == uVar18) {
                    uVar14 = 0;
                  }
                  dVar34 = paVar32[(long)local_138 + uVar14].x - paVar6[uVar24].x;
                  dVar35 = paVar32[(long)local_138 + uVar14].y - paVar6[uVar24].y;
                  dVar36 = paVar32[(long)local_138 + uVar14].z - paVar6[uVar24].z;
                  if (ABS(dVar36 * dVar36 + dVar34 * dVar34 + dVar35 * dVar35) < 1e-06) {
                    paVar21 = paVar6 + uVar17 + -1;
                    if (paVar6 < paVar21) {
                      paVar6 = paVar32 + uVar8;
                      do {
                        paVar15 = paVar6 + 1;
                        local_98 = paVar6->z;
                        local_a8 = paVar6->x;
                        dStack_a0 = paVar6->y;
                        paVar6->z = paVar21->z;
                        dVar34 = paVar21->y;
                        paVar6->x = paVar21->x;
                        paVar6->y = dVar34;
                        paVar21->z = local_98;
                        paVar21->x = local_a8;
                        paVar21->y = dStack_a0;
                        paVar21 = paVar21 + -1;
                        paVar6 = paVar15;
                      } while (paVar15 < paVar21);
                    }
                    puVar16 = local_c0.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start + uVar8 + (uVar17 - 1);
                    if (local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start + uVar8 < puVar16) {
                      puVar7 = local_c0.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start + uVar8;
                      do {
                        puVar29 = puVar7 + 1;
                        uVar5 = *puVar7;
                        *puVar7 = *puVar16;
                        *puVar16 = uVar5;
                        puVar16 = puVar16 + -1;
                        puVar7 = puVar29;
                      } while (puVar29 < puVar16);
                    }
                    while (uVar17 = uVar17 - 1, uVar17 != 0) {
                      uVar12 = uVar8 + 1;
                      uVar5 = local_c0.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start[uVar8];
                      local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar8] =
                           local_c0.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start[uVar12];
                      local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar12] = uVar5;
                      uVar8 = uVar12;
                    }
                  }
                  uVar17 = local_c8 + 0x3f;
                  if (-1 < (long)local_c8) {
                    uVar17 = local_c8;
                  }
                  local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                  [((long)uVar17 >> 6) +
                   ((ulong)((local_c8 & (ulong)local_d0) < 0x8000000000000001) - 1)] =
                       local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                       [((long)uVar17 >> 6) +
                        ((ulong)((local_c8 & (ulong)local_d0) < 0x8000000000000001) - 1)] |
                       1L << ((byte)local_c8 & 0x3f);
                  if (iStack_100._M_current == local_f8) {
                    std::vector<unsigned_long,std::allocator<unsigned_long>>::
                    _M_realloc_insert<unsigned_long_const&>
                              ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_108,
                               iStack_100,&local_c8);
                  }
                  else {
                    *iStack_100._M_current = local_c8;
                    iStack_100._M_current = iStack_100._M_current + 1;
                  }
                }
              }
              uVar33 = uVar33 + 1;
            } while (uVar33 != uVar18);
          }
        } while (local_108 != iStack_100._M_current);
      }
      if (local_108 != (unsigned_long *)0x0) {
        operator_delete(local_108,(long)local_f8 - (long)local_108);
      }
    } while (local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_offset != 0 ||
             local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p !=
             local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_p);
  }
  if (local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != (ulong *)0x0) {
    operator_delete(local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (ulong *)0x0;
    local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (ulong *)0x0;
    local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  operator_delete(pdVar9,0x50);
  if (local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<aiVector3t<double>,_std::pair<const_aiVector3t<double>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::_Select1st<std::pair<const_aiVector3t<double>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_Assimp::IFC::CompareVector,_std::allocator<std::pair<const_aiVector3t<double>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ::~_Rb_tree(&local_60);
  if (local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void TempMesh::FixupFaceOrientation()
{
    const IfcVector3 vavg = Center();

    // create a list of start indices for all faces to allow random access to faces
    std::vector<size_t> faceStartIndices(mVertcnt.size());
    for( size_t i = 0, a = 0; a < mVertcnt.size(); i += mVertcnt[a], ++a )
        faceStartIndices[a] = i;

    // list all faces on a vertex
    std::map<IfcVector3, std::vector<size_t>, CompareVector> facesByVertex;
    for( size_t a = 0; a < mVertcnt.size(); ++a )
    {
        for( size_t b = 0; b < mVertcnt[a]; ++b )
            facesByVertex[mVerts[faceStartIndices[a] + b]].push_back(a);
    }
    // determine neighbourhood for all polys
    std::vector<size_t> neighbour(mVerts.size(), SIZE_MAX);
    std::vector<size_t> tempIntersect(10);
    for( size_t a = 0; a < mVertcnt.size(); ++a )
    {
        for( size_t b = 0; b < mVertcnt[a]; ++b )
        {
            size_t ib = faceStartIndices[a] + b, nib = faceStartIndices[a] + (b + 1) % mVertcnt[a];
            const std::vector<size_t>& facesOnB = facesByVertex[mVerts[ib]];
            const std::vector<size_t>& facesOnNB = facesByVertex[mVerts[nib]];
            // there should be exactly one or two faces which appear in both lists. Our face and the other side
            std::vector<size_t>::iterator sectstart = tempIntersect.begin();
            std::vector<size_t>::iterator sectend = std::set_intersection(
                facesOnB.begin(), facesOnB.end(), facesOnNB.begin(), facesOnNB.end(), sectstart);

            if( std::distance(sectstart, sectend) != 2 )
                continue;
            if( *sectstart == a )
                ++sectstart;
            neighbour[ib] = *sectstart;
        }
    }

    // now we're getting started. We take the face which is the farthest away from the center. This face is most probably
    // facing outwards. So we reverse this face to point outwards in relation to the center. Then we adapt neighbouring
    // faces to have the same winding until all faces have been tested.
    std::vector<bool> faceDone(mVertcnt.size(), false);
    while( std::count(faceDone.begin(), faceDone.end(), false) != 0 )
    {
        // find the farthest of the remaining faces
        size_t farthestIndex = SIZE_MAX;
        IfcFloat farthestDistance = -1.0;
        for( size_t a = 0; a < mVertcnt.size(); ++a )
        {
            if( faceDone[a] )
                continue;
            IfcVector3 faceCenter = std::accumulate(mVerts.begin() + faceStartIndices[a],
                mVerts.begin() + faceStartIndices[a] + mVertcnt[a], IfcVector3(0.0)) / IfcFloat(mVertcnt[a]);
            IfcFloat dst = (faceCenter - vavg).SquareLength();
            if( dst > farthestDistance ) { farthestDistance = dst; farthestIndex = a; }
        }

        // calculate its normal and reverse the poly if its facing towards the mesh center
        IfcVector3 farthestNormal = ComputePolygonNormal(mVerts.data() + faceStartIndices[farthestIndex], mVertcnt[farthestIndex]);
        IfcVector3 farthestCenter = std::accumulate(mVerts.begin() + faceStartIndices[farthestIndex],
            mVerts.begin() + faceStartIndices[farthestIndex] + mVertcnt[farthestIndex], IfcVector3(0.0))
            / IfcFloat(mVertcnt[farthestIndex]);
        // We accept a bit of negative orientation without reversing. In case of doubt, prefer the orientation given in
        // the file.
        if( (farthestNormal * (farthestCenter - vavg).Normalize()) < -0.4 )
        {
            size_t fsi = faceStartIndices[farthestIndex], fvc = mVertcnt[farthestIndex];
            std::reverse(mVerts.begin() + fsi, mVerts.begin() + fsi + fvc);
            std::reverse(neighbour.begin() + fsi, neighbour.begin() + fsi + fvc);
            // because of the neighbour index belonging to the edge starting with the point at the same index, we need to
            // cycle the neighbours through to match the edges again.
            // Before: points A - B - C - D with edge neighbour p - q - r - s
            // After: points D - C - B - A, reversed neighbours are s - r - q - p, but the should be
            //                r   q   p   s
            for( size_t a = 0; a < fvc - 1; ++a )
                std::swap(neighbour[fsi + a], neighbour[fsi + a + 1]);
        }
        faceDone[farthestIndex] = true;
        std::vector<size_t> todo;
        todo.push_back(farthestIndex);

        // go over its neighbour faces recursively and adapt their winding order to match the farthest face
        while( !todo.empty() )
        {
            size_t tdf = todo.back();
            size_t vsi = faceStartIndices[tdf], vc = mVertcnt[tdf];
            todo.pop_back();

            // check its neighbours
            for( size_t a = 0; a < vc; ++a )
            {
                // ignore neighbours if we already checked them
                size_t nbi = neighbour[vsi + a];
                if( nbi == SIZE_MAX || faceDone[nbi] )
                    continue;

                const IfcVector3& vp = mVerts[vsi + a];
                size_t nbvsi = faceStartIndices[nbi], nbvc = mVertcnt[nbi];
                std::vector<IfcVector3>::iterator it = std::find_if(mVerts.begin() + nbvsi, mVerts.begin() + nbvsi + nbvc, FindVector(vp));
                ai_assert(it != mVerts.begin() + nbvsi + nbvc);
                size_t nb_vidx = std::distance(mVerts.begin() + nbvsi, it);
                // two faces winded in the same direction should have a crossed edge, where one face has p0->p1 and the other
                // has p1'->p0'. If the next point on the neighbouring face is also the next on the current face, we need
                // to reverse the neighbour
                nb_vidx = (nb_vidx + 1) % nbvc;
                size_t oursideidx = (a + 1) % vc;
                if( FuzzyVectorCompare(1e-6)(mVerts[vsi + oursideidx], mVerts[nbvsi + nb_vidx]) )
                {
                    std::reverse(mVerts.begin() + nbvsi, mVerts.begin() + nbvsi + nbvc);
                    std::reverse(neighbour.begin() + nbvsi, neighbour.begin() + nbvsi + nbvc);
                    for( size_t a = 0; a < nbvc - 1; ++a )
                        std::swap(neighbour[nbvsi + a], neighbour[nbvsi + a + 1]);
                }

                // either way we're done with the neighbour. Mark it as done and continue checking from there recursively
                faceDone[nbi] = true;
                todo.push_back(nbi);
            }
        }

        // no more faces reachable from this part of the surface, start over with a disjunct part and its farthest face
    }
}